

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CodeDropTable(Parse *pParse,Table *pTab,int iDb,int isView)

{
  int iVar1;
  uint uVar2;
  sqlite3 *db;
  Db *pDVar3;
  char *pcVar4;
  Table *pTable;
  int iVar5;
  int iTable;
  Vdbe *p;
  Trigger *pTrigger;
  Schema *pSVar6;
  ushort uVar7;
  Index *pIVar8;
  ulong uVar9;
  int iVar10;
  Schema **ppSVar11;
  int iVar12;
  Parse *pPVar13;
  HashElem *pHVar14;
  
  db = pParse->db;
  p = pParse->pVdbe;
  pDVar3 = db->aDb;
  if (p == (Vdbe *)0x0) {
    p = allocVdbe(pParse);
  }
  pPVar13 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar13 = pParse;
  }
  sqlite3CodeVerifySchema(pParse,iDb);
  pPVar13->writeMask = pPVar13->writeMask | 1 << ((byte)iDb & 0x1f);
  pPVar13->isMultiWrite = pPVar13->isMultiWrite | 1;
  if (pTab->nModuleArg != 0) {
    sqlite3VdbeAddOp3(p,0x99,0,0,0);
  }
  for (pTrigger = sqlite3TriggerList((Parse *)pParse->db->aDb[1].pSchema,
                                     (Table *)(ulong)pParse->disableTriggers);
      pTrigger != (Trigger *)0x0; pTrigger = pTrigger->pNext) {
    sqlite3DropTriggerPtr(pParse,pTrigger);
  }
  if ((pTab->tabFlags & 8) != 0) {
    sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_sequence WHERE name=%Q",pDVar3[iDb].zDbSName,
                       pTab->zName);
  }
  sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE tbl_name=%Q and type!=\'trigger\'",
                     pDVar3[iDb].zDbSName);
  iVar5 = pTab->nModuleArg;
  if (isView == 0) {
    if (iVar5 == 0) {
      iVar5 = pTab->tnum;
      iVar12 = 0;
      while( true ) {
        iTable = 0;
        if (iVar5 < iVar12) {
          iTable = iVar5;
        }
        if (iVar12 == 0) {
          iTable = iVar5;
        }
        for (pIVar8 = pTab->pIndex; pIVar8 != (Index *)0x0; pIVar8 = pIVar8->pNext) {
          iVar1 = pIVar8->tnum;
          iVar10 = iTable;
          if (iTable < iVar1) {
            iVar10 = iVar1;
          }
          if (iVar1 < iVar12) {
            iTable = iVar10;
          }
          if (iVar12 == 0) {
            iTable = iVar10;
          }
        }
        if (iTable == 0) break;
        if (pTab->pSchema == (Schema *)0x0) {
          uVar9 = 0xfff0bdc0;
        }
        else {
          uVar2 = pParse->db->nDb;
          if ((int)uVar2 < 1) {
            uVar9 = 0;
          }
          else {
            ppSVar11 = &pParse->db->aDb->pSchema;
            uVar9 = 0;
            do {
              if (*ppSVar11 == pTab->pSchema) goto LAB_00165c8d;
              uVar9 = uVar9 + 1;
              ppSVar11 = ppSVar11 + 4;
            } while (uVar2 != uVar9);
            uVar9 = (ulong)uVar2;
          }
        }
LAB_00165c8d:
        destroyRootPage(pParse,iTable,(int)uVar9);
        iVar12 = iTable;
      }
      iVar5 = pTab->nModuleArg;
      goto LAB_00165b0f;
    }
  }
  else {
LAB_00165b0f:
    if (iVar5 == 0) goto LAB_00165b4a;
  }
  pcVar4 = pTab->zName;
  iVar5 = sqlite3VdbeAddOp3(p,0x9b,iDb,0,0);
  sqlite3VdbeChangeP4(p,iVar5,pcVar4,0);
LAB_00165b4a:
  pcVar4 = pTab->zName;
  iVar5 = sqlite3VdbeAddOp3(p,0x8b,iDb,0,0);
  sqlite3VdbeChangeP4(p,iVar5,pcVar4,0);
  sqlite3VdbeAddOp3(pParse->pVdbe,0x66,iDb,1,(pParse->db->aDb[iDb].pSchema)->schema_cookie + 1);
  pSVar6 = db->aDb[iDb].pSchema;
  uVar7 = pSVar6->schemaFlags;
  if ((uVar7 & 2) != 0) {
    pHVar14 = (pSVar6->tblHash).first;
    if (pHVar14 != (HashElem *)0x0) {
      do {
        pTable = (Table *)pHVar14->data;
        if (pTable->pSelect != (Select *)0x0) {
          sqlite3DeleteColumnNames(db,pTable);
          pTable->aCol = (Column *)0x0;
          pTable->nCol = 0;
        }
        pHVar14 = pHVar14->next;
      } while (pHVar14 != (HashElem *)0x0);
      pSVar6 = db->aDb[iDb].pSchema;
      uVar7 = pSVar6->schemaFlags;
    }
    pSVar6->schemaFlags = uVar7 & 0xfffd;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeDropTable(Parse *pParse, Table *pTab, int iDb, int isView){
  Vdbe *v;
  sqlite3 *db = pParse->db;
  Trigger *pTrigger;
  Db *pDb = &db->aDb[iDb];

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp0(v, OP_VBegin);
  }
#endif

  /* Drop all triggers associated with the table being dropped. Code
  ** is generated to remove entries from sqlite_master and/or
  ** sqlite_temp_master if required.
  */
  pTrigger = sqlite3TriggerList(pParse, pTab);
  while( pTrigger ){
    assert( pTrigger->pSchema==pTab->pSchema || 
        pTrigger->pSchema==db->aDb[1].pSchema );
    sqlite3DropTriggerPtr(pParse, pTrigger);
    pTrigger = pTrigger->pNext;
  }

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* Remove any entries of the sqlite_sequence table associated with
  ** the table being dropped. This is done before the table is dropped
  ** at the btree level, in case the sqlite_sequence table needs to
  ** move as a result of the drop (can happen in auto-vacuum mode).
  */
  if( pTab->tabFlags & TF_Autoincrement ){
    sqlite3NestedParse(pParse,
      "DELETE FROM %Q.sqlite_sequence WHERE name=%Q",
      pDb->zDbSName, pTab->zName
    );
  }
#endif

  /* Drop all SQLITE_MASTER table and index entries that refer to the
  ** table. The program name loops through the master table and deletes
  ** every row that refers to a table of the same name as the one being
  ** dropped. Triggers are handled separately because a trigger can be
  ** created in the temp database that refers to a table in another
  ** database.
  */
  sqlite3NestedParse(pParse, 
      "DELETE FROM %Q.%s WHERE tbl_name=%Q and type!='trigger'",
      pDb->zDbSName, MASTER_NAME, pTab->zName);
  if( !isView && !IsVirtual(pTab) ){
    destroyTable(pParse, pTab);
  }

  /* Remove the table entry from SQLite's internal schema and modify
  ** the schema cookie.
  */
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp4(v, OP_VDestroy, iDb, 0, 0, pTab->zName, 0);
  }
  sqlite3VdbeAddOp4(v, OP_DropTable, iDb, 0, 0, pTab->zName, 0);
  sqlite3ChangeCookie(pParse, iDb);
  sqliteViewResetAll(db, iDb);
}